

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

Gia_Obj_t * Gia_ManFraigMarkCos(Gia_Man_t *p,Gia_Obj_t *pObj,int fMark)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  
  if ((-1 < (int)(uint)*(undefined8 *)pObj) ||
     (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                  ,0xed,"Gia_Obj_t *Gia_ManFraigMarkCos(Gia_Man_t *, Gia_Obj_t *, int)");
  }
  pGVar4 = pObj;
  if ((~*(uint *)pObj & 0x1fffffff) != 0 && (int)*(uint *)pObj < 0) {
    do {
      if (fMark != 0) {
        pGVar1 = p->pObjs;
        if ((pGVar4 < pGVar1) || (pGVar1 + p->nObjs <= pGVar4)) {
LAB_0022e878:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar5 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
        if (p->nTravIdsAlloc <= iVar5) {
LAB_0022e897:
          __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
        }
        piVar2 = p->pTravIds;
        piVar2[iVar5] = p->nTravIds;
        uVar6 = (uint)*(undefined8 *)pGVar4 & 0x1fffffff;
        pGVar3 = (Gia_Obj_t *)((long)pGVar4 + (ulong)(uVar6 * 4) * -3);
        if ((pGVar3 < pGVar1) || (pGVar1 + p->nObjs <= pGVar3)) goto LAB_0022e878;
        iVar5 = (int)((long)(((long)pObj - (long)pGVar1) + (ulong)(uVar6 << 2) * -3) >> 2) *
                -0x55555555;
        if (p->nTravIdsAlloc <= iVar5) goto LAB_0022e897;
        piVar2[iVar5] = p->nTravIds;
      }
      pGVar1 = pGVar4 + -1;
      pGVar4 = pGVar4 + -1;
    } while (((int)(uint)*(undefined8 *)pGVar1 < 0) &&
            (pObj = pObj + -1, ((uint)*(undefined8 *)pGVar1 & 0x1fffffff) != 0x1fffffff));
  }
  return pGVar4;
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkCos( Gia_Man_t * p, Gia_Obj_t * pObj, int fMark )
{
    for ( assert( Gia_ObjIsCo(pObj) ); Gia_ObjIsCo(pObj); pObj-- )
        if ( fMark )
        {
            Gia_ObjSetTravIdCurrent( p, pObj );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
        }
    return pObj;
}